

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O3

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::test(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
       *__return_storage_ptr__,
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      *this,int i,Status stat)

{
  bool *pbVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int32_t iVar5;
  int iVar6;
  cpp_dec_float<50U,_int,_void> *pcVar7;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  fpclass_type fVar8;
  cpp_dec_float<50U,_int,_void> *pcVar9;
  type t;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_a8.fpclass = cpp_dec_float_finite;
  local_a8.prec_elem = 10;
  local_a8.data._M_elems[0] = 0;
  local_a8.data._M_elems[1] = 0;
  local_a8.data._M_elems[2] = 0;
  local_a8.data._M_elems[3] = 0;
  local_a8.data._M_elems[4] = 0;
  local_a8.data._M_elems[5] = 0;
  local_a8.data._M_elems._24_5_ = 0;
  local_a8.data._M_elems[7]._1_3_ = 0;
  local_a8.data._M_elems._32_5_ = 0;
  local_a8.data._M_elems[9]._1_3_ = 0;
  local_a8.exp = 0;
  local_a8.neg = false;
  switch(stat) {
  case D_FREE:
  case D_ON_BOTH:
    pcVar7 = &(this->thePvec->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
    pcVar9 = &(this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .left.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
    local_68.fpclass = cpp_dec_float_finite;
    local_68.prec_elem = 10;
    local_68.data._M_elems[0] = 0;
    local_68.data._M_elems[1] = 0;
    local_68.data._M_elems[2] = 0;
    local_68.data._M_elems[3] = 0;
    local_68.data._M_elems[4] = 0;
    local_68.data._M_elems[5] = 0;
    local_68.data._M_elems._24_5_ = 0;
    local_68.data._M_elems[7]._1_3_ = 0;
    local_68.data._M_elems._32_5_ = 0;
    local_68.data._M_elems[9]._1_3_ = 0;
    local_68.exp = 0;
    local_68.neg = false;
    if (&local_68 == pcVar9) {
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=(&local_68,pcVar7);
      if (local_68.data._M_elems[0] != 0 || local_68.fpclass != cpp_dec_float_finite) {
        local_68.neg = (bool)(local_68.neg ^ 1);
      }
    }
    else {
      if (&local_68 != pcVar7) {
        uVar2 = *(undefined8 *)((pcVar7->data)._M_elems + 8);
        local_68.data._M_elems._32_5_ = SUB85(uVar2,0);
        local_68.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar2 >> 0x28);
        local_68.data._M_elems._0_8_ = *(undefined8 *)(pcVar7->data)._M_elems;
        local_68.data._M_elems._8_8_ = *(undefined8 *)((pcVar7->data)._M_elems + 2);
        local_68.data._M_elems._16_8_ = *(undefined8 *)((pcVar7->data)._M_elems + 4);
        uVar2 = *(undefined8 *)((pcVar7->data)._M_elems + 6);
        local_68.data._M_elems._24_5_ = SUB85(uVar2,0);
        local_68.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar2 >> 0x28);
        local_68.exp = pcVar7->exp;
        local_68.neg = pcVar7->neg;
        local_68.fpclass = pcVar7->fpclass;
        local_68.prec_elem = pcVar7->prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=(&local_68,pcVar9);
    }
    local_a8.data._M_elems._32_5_ = local_68.data._M_elems._32_5_;
    local_a8.data._M_elems[9]._1_3_ = local_68.data._M_elems[9]._1_3_;
    local_a8.data._M_elems[4] = local_68.data._M_elems[4];
    local_a8.data._M_elems[5] = local_68.data._M_elems[5];
    local_a8.data._M_elems._24_5_ = local_68.data._M_elems._24_5_;
    local_a8.data._M_elems[7]._1_3_ = local_68.data._M_elems[7]._1_3_;
    local_a8.data._M_elems[0] = local_68.data._M_elems[0];
    local_a8.data._M_elems[1] = local_68.data._M_elems[1];
    local_a8.data._M_elems[2] = local_68.data._M_elems[2];
    local_a8.data._M_elems[3] = local_68.data._M_elems[3];
    local_a8.exp = local_68.exp;
    local_a8.neg = local_68.neg;
    local_a8.fpclass = local_68.fpclass;
    local_a8.prec_elem = local_68.prec_elem;
    if (local_68.fpclass != cpp_dec_float_NaN) {
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                (&local_68,0,(type *)0x0);
      iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                        (&local_a8,&local_68);
      if (iVar6 < 0) {
        *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
             CONCAT35(local_a8.data._M_elems[9]._1_3_,local_a8.data._M_elems._32_5_);
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
             local_a8.data._M_elems._16_8_;
        *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 6) =
             CONCAT35(local_a8.data._M_elems[7]._1_3_,local_a8.data._M_elems._24_5_);
        *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems =
             local_a8.data._M_elems._0_8_;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) =
             local_a8.data._M_elems._8_8_;
        (__return_storage_ptr__->m_backend).exp = local_a8.exp;
        (__return_storage_ptr__->m_backend).neg = local_a8.neg;
        (__return_storage_ptr__->m_backend).fpclass = local_a8.fpclass;
        (__return_storage_ptr__->m_backend).prec_elem = local_a8.prec_elem;
        return __return_storage_ptr__;
      }
    }
    goto LAB_002824cb;
  case D_ON_UPPER:
    pcVar7 = &(this->thePvec->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
    pcVar9 = &(this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .left.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
    break;
  case D_ON_LOWER:
LAB_002824cb:
    pcVar7 = &(this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .right.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
    pcVar9 = &(this->thePvec->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
    (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
    (__return_storage_ptr__->m_backend).prec_elem = 10;
    goto LAB_002824ea;
  case P_ON_LOWER:
    pcVar7 = &(this->thePvec->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
    pcVar9 = &(this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .object.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
    break;
  default:
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              (&__return_storage_ptr__->m_backend,0,(type *)0x0);
    return __return_storage_ptr__;
  case P_ON_UPPER:
    pcVar7 = &(this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .object.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
    pcVar9 = &(this->thePvec->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
    break;
  case P_FREE:
    pcVar7 = &(this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .object.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
    pcVar9 = &(this->thePvec->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
    local_68.fpclass = cpp_dec_float_finite;
    local_68.prec_elem = 10;
    local_68.data._M_elems[0] = 0;
    local_68.data._M_elems[1] = 0;
    local_68.data._M_elems[2] = 0;
    local_68.data._M_elems[3] = 0;
    local_68.data._M_elems[4] = 0;
    local_68.data._M_elems[5] = 0;
    local_68.data._M_elems._24_5_ = 0;
    local_68.data._M_elems[7]._1_3_ = 0;
    local_68.data._M_elems._32_5_ = 0;
    local_68.data._M_elems[9]._1_3_ = 0;
    local_68.exp = 0;
    local_68.neg = false;
    if (&local_68 == pcVar9) {
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=(&local_68,pcVar7);
      if (local_68.data._M_elems[0] != 0 || local_68.fpclass != cpp_dec_float_finite) {
        local_68.neg = (bool)(local_68.neg ^ 1);
      }
    }
    else {
      if (&local_68 != pcVar7) {
        uVar2 = *(undefined8 *)((pcVar7->data)._M_elems + 8);
        local_68.data._M_elems._32_5_ = SUB85(uVar2,0);
        local_68.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar2 >> 0x28);
        local_68.data._M_elems._0_8_ = *(undefined8 *)(pcVar7->data)._M_elems;
        local_68.data._M_elems._8_8_ = *(undefined8 *)((pcVar7->data)._M_elems + 2);
        local_68.data._M_elems._16_8_ = *(undefined8 *)((pcVar7->data)._M_elems + 4);
        uVar2 = *(undefined8 *)((pcVar7->data)._M_elems + 6);
        local_68.data._M_elems._24_5_ = SUB85(uVar2,0);
        local_68.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar2 >> 0x28);
        local_68.exp = pcVar7->exp;
        local_68.neg = pcVar7->neg;
        local_68.fpclass = pcVar7->fpclass;
        local_68.prec_elem = pcVar7->prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=(&local_68,pcVar9);
    }
    local_a8.data._M_elems._32_5_ = local_68.data._M_elems._32_5_;
    local_a8.data._M_elems[9]._1_3_ = local_68.data._M_elems[9]._1_3_;
    local_a8.data._M_elems[4] = local_68.data._M_elems[4];
    local_a8.data._M_elems[5] = local_68.data._M_elems[5];
    local_a8.data._M_elems._24_5_ = local_68.data._M_elems._24_5_;
    local_a8.data._M_elems[7]._1_3_ = local_68.data._M_elems[7]._1_3_;
    local_a8.data._M_elems[0] = local_68.data._M_elems[0];
    local_a8.data._M_elems[1] = local_68.data._M_elems[1];
    local_a8.data._M_elems[2] = local_68.data._M_elems[2];
    local_a8.data._M_elems[3] = local_68.data._M_elems[3];
    local_a8.exp = local_68.exp;
    local_a8.neg = local_68.neg;
    local_a8.fpclass = local_68.fpclass;
    local_a8.prec_elem = local_68.prec_elem;
    fVar8 = cpp_dec_float_NaN;
    if (local_68.fpclass != cpp_dec_float_NaN) {
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                (&local_68,0,(type *)0x0);
      iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                        (&local_a8,&local_68);
      local_68.exp = local_a8.exp;
      local_68.neg = local_a8.neg;
      local_68.prec_elem = local_a8.prec_elem;
      fVar8 = local_a8.fpclass;
      if (iVar6 < 0) {
        *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
             CONCAT35(local_a8.data._M_elems[9]._1_3_,local_a8.data._M_elems._32_5_);
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
             local_a8.data._M_elems._16_8_;
        *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 6) =
             CONCAT35(local_a8.data._M_elems[7]._1_3_,local_a8.data._M_elems._24_5_);
        *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems =
             local_a8.data._M_elems._0_8_;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) =
             local_a8.data._M_elems._8_8_;
        (__return_storage_ptr__->m_backend).exp = local_a8.exp;
        (__return_storage_ptr__->m_backend).neg = local_a8.neg;
        (__return_storage_ptr__->m_backend).fpclass = local_a8.fpclass;
        (__return_storage_ptr__->m_backend).prec_elem = local_a8.prec_elem;
        return __return_storage_ptr__;
      }
    }
    *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems = local_a8.data._M_elems._0_8_;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) =
         local_a8.data._M_elems._8_8_;
    *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
         CONCAT35(local_a8.data._M_elems[9]._1_3_,local_a8.data._M_elems._32_5_);
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
         local_a8.data._M_elems._16_8_;
    *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 6) =
         CONCAT35(local_a8.data._M_elems[7]._1_3_,local_a8.data._M_elems._24_5_);
    (__return_storage_ptr__->m_backend).exp = local_68.exp;
    (__return_storage_ptr__->m_backend).neg = local_68.neg;
    (__return_storage_ptr__->m_backend).fpclass = fVar8;
    (__return_storage_ptr__->m_backend).prec_elem = local_68.prec_elem;
    if (fVar8 == cpp_dec_float_finite && (__return_storage_ptr__->m_backend).data._M_elems[0] == 0)
    {
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->m_backend).neg = (bool)(local_68.neg ^ 1);
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
  (__return_storage_ptr__->m_backend).prec_elem = 10;
LAB_002824ea:
  (__return_storage_ptr__->m_backend).data._M_elems[0] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[1] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[2] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[3] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[4] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[5] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[6] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[7] = 0;
  *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x1d) = 0;
  *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x25) = 0;
  if (pcVar9 == &__return_storage_ptr__->m_backend) {
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
              (&__return_storage_ptr__->m_backend,pcVar7);
    if ((__return_storage_ptr__->m_backend).data._M_elems[0] != 0 ||
        (__return_storage_ptr__->m_backend).fpclass != cpp_dec_float_finite) {
      pbVar1 = &(__return_storage_ptr__->m_backend).neg;
      *pbVar1 = (bool)(*pbVar1 ^ 1);
    }
  }
  else {
    if (pcVar7 != &__return_storage_ptr__->m_backend) {
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
           *(undefined8 *)((pcVar7->data)._M_elems + 8);
      uVar2 = *(undefined8 *)(pcVar7->data)._M_elems;
      uVar3 = *(undefined8 *)((pcVar7->data)._M_elems + 2);
      uVar4 = *(undefined8 *)((pcVar7->data)._M_elems + 6);
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
           *(undefined8 *)((pcVar7->data)._M_elems + 4);
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6) = uVar4;
      *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems = uVar2;
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) = uVar3;
      (__return_storage_ptr__->m_backend).exp = pcVar7->exp;
      (__return_storage_ptr__->m_backend).neg = pcVar7->neg;
      iVar5 = pcVar7->prec_elem;
      (__return_storage_ptr__->m_backend).fpclass = pcVar7->fpclass;
      (__return_storage_ptr__->m_backend).prec_elem = iVar5;
    }
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
              (&__return_storage_ptr__->m_backend,pcVar9);
  }
  return __return_storage_ptr__;
}

Assistant:

R SPxSolverBase<R>::test(int i, typename SPxBasisBase<R>::Desc::Status stat) const
{
   assert(type() == ENTER);
   assert(!isBasic(stat));

   R x;

   switch(stat)
   {
   case SPxBasisBase<R>::Desc::D_FREE:
   case SPxBasisBase<R>::Desc::D_ON_BOTH:
      assert(rep() == ROW);
      x = (*thePvec)[i] - this->lhs(i);

      if(x < 0)
         return x;

   // no break: next is else case
   //lint -fallthrough
   case SPxBasisBase<R>::Desc::D_ON_LOWER:
      assert(rep() == ROW);
      return this->rhs(i) - (*thePvec)[i];

   case SPxBasisBase<R>::Desc::D_ON_UPPER:
      assert(rep() == ROW);
      return (*thePvec)[i] - this->lhs(i);

   case SPxBasisBase<R>::Desc::P_ON_UPPER:
      assert(rep() == COLUMN);
      return this->maxObj(i) - (*thePvec)[i];

   case SPxBasisBase<R>::Desc::P_ON_LOWER:
      assert(rep() == COLUMN);
      return (*thePvec)[i] - this->maxObj(i);

   case SPxBasisBase<R>::Desc::P_FREE :
      x = this->maxObj(i) - (*thePvec)[i];
      return (x < 0) ? x : -x;

   default:
      return 0;
   }
}